

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O1

int rc2_cbc_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t inl)

{
  void *pvVar1;
  
  pvVar1 = ctx->cipher_data;
  if (0xffff < inl) {
    do {
      RC2_cbc_encrypt(in,out,0x10000,(RC2_KEY *)((long)pvVar1 + 4),ctx->iv,ctx->encrypt);
      inl = inl - 0x10000;
      in = in + 0x10000;
      out = out + 0x10000;
    } while (0xffff < inl);
  }
  if (inl != 0) {
    RC2_cbc_encrypt(in,out,inl,(RC2_KEY *)((long)pvVar1 + 4),ctx->iv,ctx->encrypt);
  }
  return 1;
}

Assistant:

static int rc2_cbc_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out, const uint8_t *in,
                          size_t inl) {
  EVP_RC2_KEY *key = (EVP_RC2_KEY *)ctx->cipher_data;
  static const size_t kChunkSize = 0x10000;

  while (inl >= kChunkSize) {
    RC2_cbc_encrypt(in, out, kChunkSize, &key->ks, ctx->iv, ctx->encrypt);
    inl -= kChunkSize;
    in += kChunkSize;
    out += kChunkSize;
  }
  if (inl) {
    RC2_cbc_encrypt(in, out, inl, &key->ks, ctx->iv, ctx->encrypt);
  }
  return 1;
}